

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

long __thiscall Fl_Table::row_scroll_position(Fl_Table *this,int row)

{
  ulong uVar1;
  int t;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = 0;
  uVar3 = uVar1;
  if (this->toprow <= row && (long)this->toprow_scrollpos != 0xffffffffffffffff) {
    uVar1 = (long)this->toprow_scrollpos;
    uVar3 = (ulong)(uint)this->toprow;
  }
  if ((int)uVar3 < row) {
    do {
      iVar2 = (int)uVar3;
      if (iVar2 < 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        if (iVar2 < (int)(this->_rowheights)._size) {
          lVar4 = (long)(this->_rowheights).arr[uVar3];
        }
      }
      uVar1 = uVar1 + lVar4;
      uVar3 = (ulong)(iVar2 + 1U);
    } while (row != iVar2 + 1U);
  }
  return uVar1;
}

Assistant:

long Fl_Table::row_scroll_position(int row) {
  int startrow = 0;
  long scroll = 0; 
  // OPTIMIZATION: 
  //     Attempt to use precomputed row scroll position
  //
  if ( toprow_scrollpos != -1 && row >= toprow ) {
    scroll = toprow_scrollpos;
    startrow = toprow;
  }
  for ( int t=startrow; t<row; t++ ) {
    scroll += row_height(t);
  }
  return(scroll);
}